

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8b1c::do_encode_bytes_test
          (anon_unknown_dwarf_8b1c *this,span<const_std::byte,_18446744073709551615UL> a)

{
  pointer req;
  char *pcVar1;
  size_type sz_1;
  undefined1 local_160 [8];
  key_encoder enc;
  pointer pbStack_40;
  int cmp;
  size_type sz;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  req = a._M_ptr;
  enc.ibuf._248_8_ = local_160;
  enc.buf = &DAT_00000100;
  enc.cap = 0;
  pbStack_40 = req;
  unodb::key_encoder::ensure_available((key_encoder *)enc.ibuf._248_8_,(size_t)req);
  memcpy((void *)(enc.ibuf._248_8_ + enc.cap),this,(size_t)req);
  enc.cap = (size_t)(req + enc.cap);
  enc.off._4_4_ = memcmp((void *)enc.ibuf._248_8_,this,(size_t)pbStack_40);
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_20._M_head_impl._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&sz,"(0)","(cmp)",(int *)&local_20,(int *)((long)&enc.off + 4));
  if ((char)sz == '\0') {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x26c,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_20._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)enc.cap;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&sz,"(sz)","(enc.size_bytes())",(unsigned_long *)&stack0xffffffffffffffc0,
             (unsigned_long *)&local_20);
  if ((char)sz == '\0') {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x26d,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (local_20._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_20._M_head_impl + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  if (&DAT_00000100 < enc.buf) {
    free((void *)enc.ibuf._248_8_);
  }
  return;
}

Assistant:

void do_encode_bytes_test(std::span<const std::byte> a) {
  unodb::key_encoder enc;
  const auto sz = a.size();
  enc.append_bytes(a);
  const auto cmp = std::memcmp(enc.get_key_view().data(), a.data(), sz);
  UNODB_EXPECT_EQ(0, cmp);
  UNODB_EXPECT_EQ(sz, enc.size_bytes());
}